

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

int __thiscall QuantizeData::update_histogram(QuantizeData *this,Mat *data)

{
  int *piVar1;
  reference pvVar2;
  Mat *in_RSI;
  long in_RDI;
  Mat *this_00;
  float extraout_XMM0_Da;
  int index;
  int i;
  float *data_n;
  int q;
  int size;
  int channel_num;
  float *in_stack_ffffffffffffff60;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  Mat local_68;
  float *local_28;
  int local_1c;
  int local_18;
  int local_14;
  
  local_14 = in_RSI->c;
  local_18 = in_RSI->w * in_RSI->h;
  for (local_1c = 0; local_1c < local_14; local_1c = local_1c + 1) {
    ncnn::Mat::channel(in_RSI,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    in_stack_ffffffffffffff60 = ncnn::Mat::operator_cast_to_float_(&local_68);
    this_00 = &local_68;
    ncnn::Mat::~Mat((Mat *)0x114bc4);
    local_28 = in_stack_ffffffffffffff60;
    for (local_78 = 0; local_78 < local_18; local_78 = local_78 + 1) {
      if ((local_28[local_78] != 0.0) || (NAN(local_28[local_78]))) {
        std::abs((int)this_00);
        local_80 = (int)(extraout_XMM0_Da / *(float *)(in_RDI + 0x28));
        local_84 = 0x7ff;
        piVar1 = std::min<int>(&local_80,&local_84);
        local_7c = *piVar1;
        this_00 = (Mat *)(in_RDI + 0x30);
        pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)this_00,(long)local_7c);
        *pvVar2 = *pvVar2 + 1.0;
      }
    }
  }
  return 0;
}

Assistant:

int QuantizeData::update_histogram(ncnn::Mat data)
{
    int channel_num = data.c;
    int size = data.w * data.h;

    for (int q=0; q<channel_num; q++)
    {
        const float *data_n = data.channel(q);
        for(int i=0; i<size; i++)
        {
            if (data_n[i] == 0)
                continue;

            int index = std::min(static_cast<int>(std::abs(data_n[i]) / histogram_interval), 2047);

            histogram[index]++;
        }
    }        

    return 0;
}